

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O1

FT_Bool SkipCode(TT_ExecContext exc)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)exc->length + exc->IP;
  exc->IP = lVar4;
  lVar3 = exc->codeSize;
  if (lVar4 < lVar3) {
    bVar1 = exc->code[lVar4];
    exc->opcode = bVar1;
    cVar2 = opcode_length[bVar1];
    exc->length = (int)cVar2;
    if ((bVar1 & 0xfe) == 0x40) {
      if (lVar3 <= lVar4 + 1) goto LAB_00174274;
      exc->length = 2 - (uint)exc->code[lVar4 + 1] * (int)cVar2;
    }
    if (lVar4 + exc->length <= lVar3) {
      return '\0';
    }
  }
LAB_00174274:
  exc->error = 0x83;
  return '\x01';
}

Assistant:

static FT_Bool
  SkipCode( TT_ExecContext  exc )
  {
    exc->IP += exc->length;

    if ( exc->IP < exc->codeSize )
    {
      exc->opcode = exc->code[exc->IP];

      exc->length = opcode_length[exc->opcode];
      if ( exc->length < 0 )
      {
        if ( exc->IP + 1 >= exc->codeSize )
          goto Fail_Overflow;
        exc->length = 2 - exc->length * exc->code[exc->IP + 1];
      }

      if ( exc->IP + exc->length <= exc->codeSize )
        return SUCCESS;
    }

  Fail_Overflow:
    exc->error = FT_THROW( Code_Overflow );
    return FAILURE;
  }